

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

void green_poller_swap(green_poller_t poller,int lhs,int rhs)

{
  green_future_t pgVar1;
  green_future_t pgVar2;
  green_future_t f2;
  green_future_t f1;
  int rhs_local;
  int lhs_local;
  green_poller_t poller_local;
  
  fprintf(_stderr,"swapping %d and %d.\n",(ulong)(uint)lhs,(ulong)(uint)rhs);
  if (lhs != rhs) {
    green_poller_dump(poller);
    pgVar1 = poller->futures[lhs];
    pgVar2 = poller->futures[rhs];
    if (pgVar1->slot != lhs) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","f1->slot == lhs",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x170);
      fflush(_stderr);
      abort();
    }
    if (pgVar2->slot != rhs) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","f2->slot == rhs",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x171);
      fflush(_stderr);
      abort();
    }
    poller->futures[lhs] = pgVar2;
    pgVar2->slot = lhs;
    poller->futures[rhs] = pgVar1;
    pgVar1->slot = rhs;
    green_poller_dump(poller);
  }
  return;
}

Assistant:

static void green_poller_swap(green_poller_t poller, int lhs, int rhs)
{
    fprintf(stderr, "swapping %d and %d.\n", lhs, rhs);
    if (lhs == rhs) {
        return;
    }
    green_poller_dump(poller);
    green_future_t f1 = poller->futures[lhs];
    green_future_t f2 = poller->futures[rhs];
    green_assert(f1->slot == lhs);
    green_assert(f2->slot == rhs);
    poller->futures[lhs] = f2, f2->slot = lhs;
    poller->futures[rhs] = f1, f1->slot = rhs;
    green_poller_dump(poller);
}